

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int getCursorPosition(int ifd,int ofd)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  long lVar4;
  int cols;
  int rows;
  char buf [32];
  int local_40;
  undefined1 local_3c [4];
  char local_38 [40];
  
  sVar2 = write(1,"\x1b[6n",4);
  iVar3 = -1;
  if (sVar2 == 4) {
    lVar4 = 0;
    do {
      sVar2 = read(0,local_38 + lVar4,1);
      if ((sVar2 != 1) || (local_38[lVar4] == 'R')) goto LAB_00103de7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1f);
    lVar4 = 0x1f;
LAB_00103de7:
    local_38[lVar4] = '\0';
    if ((local_38[0] == '\x1b') && (local_38[1] == '[')) {
      iVar1 = __isoc99_sscanf(local_38 + 2,"%d;%d",local_3c,&local_40);
      iVar3 = -1;
      if (iVar1 == 2) {
        iVar3 = local_40;
      }
    }
  }
  return iVar3;
}

Assistant:

static int getCursorPosition(int ifd, int ofd) {
    char buf[32];
    int cols, rows;
    unsigned int i = 0;

    /* Report cursor location */
    if (write(ofd, "\x1b[6n", 4) != 4) return -1;

    /* Read the response: ESC [ rows ; cols R */
    while (i < sizeof(buf)-1) {
        if (read(ifd,buf+i,1) != 1) break;
        if (buf[i] == 'R') break;
        i++;
    }
    buf[i] = '\0';

    /* Parse it. */
    if (buf[0] != ESC || buf[1] != '[') return -1;
    if (sscanf(buf+2,"%d;%d",&rows,&cols) != 2) return -1;
    return cols;
}